

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdNormalizeSignature(void *handle,char *signature,char **normalized_signature)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData result;
  string *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffea0;
  string local_128 [8];
  string *in_stack_fffffffffffffee0;
  allocator local_101;
  string local_100;
  ByteData local_e0;
  ByteData local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x3d1;
    local_48.funcname = "CfdNormalizeSignature";
    cfd::core::logger::warn<>(&local_48,"signature is null or empty.");
    local_6a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Failed to parameter. signature is null or empty.",&local_69);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffea0,error_code,in_stack_fffffffffffffe90);
    local_6a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (undefined8 *)0x0) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x3d7;
    local_88.funcname = "CfdNormalizeSignature";
    cfd::core::logger::warn<>(&local_88,"normalized_signature is null.");
    local_aa = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,"Failed to parameter. normalized_signature is null.",&local_a9);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe90);
    local_aa = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar4 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,local_18,paVar4);
  cfd::core::ByteData::ByteData(&local_e0,&local_100);
  cfd::core::CryptoUtil::NormalizeSignature(&local_c8,&local_e0);
  cfd::core::ByteData::~ByteData((ByteData *)0x5d4d7b);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_128,&local_c8);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffee0);
  *local_20 = pcVar3;
  std::__cxx11::string::~string(local_128);
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5d4dec);
  return local_4;
}

Assistant:

int CfdNormalizeSignature(
    void* handle, const char* signature, char** normalized_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (normalized_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "normalized_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. normalized_signature is null.");
    }

    ByteData result = CryptoUtil::NormalizeSignature(ByteData(signature));
    *normalized_signature = CreateString(result.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}